

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SphereLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,SphereLight *light
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Base_ptr p_Var2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  Property *prop;
  char *pcVar11;
  char *pcVar12;
  string *psVar13;
  Attribute *attr;
  bool bVar14;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string local_360;
  undefined1 local_340 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_328;
  string *local_318;
  string *local_310;
  long *local_308 [2];
  long local_2f8 [2];
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2e8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  undefined1 local_2a8 [16];
  code *local_298;
  code *pcStack_290;
  ios_base local_238 [264];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_130;
  _Base_ptr local_128;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_120;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_118;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_110;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_108;
  _Base_ptr local_100;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2d8._M_impl.super__Rb_tree_header._M_header;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar14 = false;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318 = err;
  local_310 = warn;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2d8,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar4) {
    p_Var10 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_100 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar14 = p_Var10 == local_100;
    if (!bVar14) {
      local_108 = &(light->super_BoundableLight).color;
      local_110 = &light->radius;
      local_118 = &(light->super_BoundableLight).intensity;
      local_120 = &(light->super_BoundableLight).extent;
      local_130 = &(light->super_BoundableLight).props;
      local_2e8 = &(light->super_BoundableLight).purpose;
      local_2e0 = &(light->super_BoundableLight).visibility;
      do {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        prop = (Property *)(p_Var10 + 2);
        psVar13 = (string *)local_2a8;
        local_2a8._0_8_ = &local_298;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar13,"inputs:color","");
        anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                  ((ParseResult *)local_340,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2d8,&local_98,prop,psVar13,local_108);
        if ((code **)local_2a8._0_8_ != &local_298) {
          operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar5 = 0;
        if ((local_340._0_8_ & 0xfffffffd) == 0) {
          iVar5 = 3;
LAB_0021a9af:
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (local_340._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0xc8d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            local_308[0] = local_2f8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_308,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[13],std::__cxx11::string>
                      (&local_360,(fmt *)local_308,(string *)"inputs:color",
                       (char (*) [13])(local_340 + 8),psVar13);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2a8,local_360._M_dataplus._M_p,
                                local_360._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            psVar13 = local_318;
            if (local_308[0] != local_2f8) {
              operator_delete(local_308[0],local_2f8[0] + 1);
            }
            if (psVar13 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar7 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_308,(ulong)(psVar13->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_360.field_2._M_allocated_capacity = *psVar1;
                local_360.field_2._8_8_ = plVar7[3];
                local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
              }
              else {
                local_360.field_2._M_allocated_capacity = *psVar1;
                local_360._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_360._M_string_length = plVar7[1];
              *plVar7 = (long)psVar1;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_360);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              if (local_308[0] != local_2f8) {
                operator_delete(local_308[0],local_2f8[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
            ::std::ios_base::~ios_base(local_238);
            iVar5 = 1;
            goto LAB_0021a9af;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._8_8_ != &aStack_328) {
          operator_delete((void *)local_340._8_8_,aStack_328._M_allocated_capacity + 1);
        }
        if (bVar4) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          psVar13 = (string *)local_2a8;
          local_2a8._0_8_ = &local_298;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar13,"inputs:radius","");
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_340,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d8,&local_b8,prop,psVar13,local_110);
          if ((code **)local_2a8._0_8_ != &local_298) {
            operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          iVar5 = 0;
          if ((local_340._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_0021acc6:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_340._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0xc8e);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_308[0] = local_2f8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_308,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        (&local_360,(fmt *)local_308,(string *)"inputs:radius",
                         (char (*) [14])(local_340 + 8),psVar13);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2a8,local_360._M_dataplus._M_p,
                                  local_360._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              psVar13 = local_318;
              if (local_308[0] != local_2f8) {
                operator_delete(local_308[0],local_2f8[0] + 1);
              }
              if (psVar13 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_308,(ulong)(psVar13->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_360.field_2._M_allocated_capacity = *psVar1;
                  local_360.field_2._8_8_ = plVar7[3];
                  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                }
                else {
                  local_360.field_2._M_allocated_capacity = *psVar1;
                  local_360._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_360._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_360);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != &local_360.field_2) {
                  operator_delete(local_360._M_dataplus._M_p,
                                  local_360.field_2._M_allocated_capacity + 1);
                }
                if (local_308[0] != local_2f8) {
                  operator_delete(local_308[0],local_2f8[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
              ::std::ios_base::~ios_base(local_238);
              iVar5 = 1;
              goto LAB_0021acc6;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._8_8_ != &aStack_328) {
            operator_delete((void *)local_340._8_8_,aStack_328._M_allocated_capacity + 1);
          }
          if (bVar4) {
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,*(long *)(p_Var10 + 1),
                       (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
            psVar13 = (string *)local_2a8;
            local_2a8._0_8_ = &local_298;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)psVar13,"inputs:intensity","");
            anon_unknown_0::ParseTypedAttribute<float>
                      ((ParseResult *)local_340,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2d8,&local_d8,prop,psVar13,local_118);
            if ((code **)local_2a8._0_8_ != &local_298) {
              operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            iVar5 = 0;
            if ((local_340._0_8_ & 0xfffffffd) == 0) {
              iVar5 = 3;
LAB_0021afdd:
              bVar4 = false;
            }
            else {
              bVar4 = true;
              if (local_340._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2a8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,"():",3);
                poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0xc90);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                local_308[0] = local_2f8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_308,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[17],std::__cxx11::string>
                          (&local_360,(fmt *)local_308,(string *)"inputs:intensity",
                           (char (*) [17])(local_340 + 8),psVar13);
                poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_2a8,local_360._M_dataplus._M_p,
                                    local_360._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_360._M_dataplus._M_p != &local_360.field_2) {
                  operator_delete(local_360._M_dataplus._M_p,
                                  local_360.field_2._M_allocated_capacity + 1);
                }
                psVar13 = local_318;
                if (local_308[0] != local_2f8) {
                  operator_delete(local_308[0],local_2f8[0] + 1);
                }
                if (psVar13 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar7 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)local_308,(ulong)(psVar13->_M_dataplus)._M_p);
                  psVar1 = (size_type *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_360.field_2._M_allocated_capacity = *psVar1;
                    local_360.field_2._8_8_ = plVar7[3];
                    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                  }
                  else {
                    local_360.field_2._M_allocated_capacity = *psVar1;
                    local_360._M_dataplus._M_p = (pointer)*plVar7;
                  }
                  local_360._M_string_length = plVar7[1];
                  *plVar7 = (long)psVar1;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_360);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_360._M_dataplus._M_p != &local_360.field_2) {
                    operator_delete(local_360._M_dataplus._M_p,
                                    local_360.field_2._M_allocated_capacity + 1);
                  }
                  if (local_308[0] != local_2f8) {
                    operator_delete(local_308[0],local_2f8[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
                ::std::ios_base::~ios_base(local_238);
                iVar5 = 1;
                goto LAB_0021afdd;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._8_8_ != &aStack_328) {
              operator_delete((void *)local_340._8_8_,aStack_328._M_allocated_capacity + 1);
            }
            if (bVar4) {
              p_Var2 = p_Var10 + 1;
              iVar5 = ::std::__cxx11::string::compare((char *)p_Var2);
              if (iVar5 == 0) {
                local_2a8._0_8_ = &local_298;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2a8,"visibility","");
                cVar8 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find(&local_2d8,(key_type *)local_2a8);
                if ((code **)local_2a8._0_8_ != &local_298) {
                  operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
                }
                iVar5 = 3;
                if ((_Rb_tree_header *)cVar8._M_node != &local_2d8._M_impl.super__Rb_tree_header)
                goto LAB_0021c018;
                if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                  local_2a8._0_8_ = &local_298;
                  local_2a8._8_8_ = 0;
                  local_298 = (code *)((ulong)local_298 & 0xffffffffffffff00);
                }
                else {
                  Attribute::type_name_abi_cxx11_((string *)local_2a8,(Attribute *)prop);
                }
                local_340._0_8_ = local_340 + 0x10;
                local_340._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_340._16_6_ = 0x6e656b6f74;
                if (local_2a8._8_8_ == 5) {
                  iVar5 = bcmp((void *)local_2a8._0_8_,local_340 + 0x10,5);
                  if ((iVar5 != 0) ||
                     (uVar3 = *(uint *)((long)&p_Var10[0x17]._M_parent + 4), 1 < uVar3))
                  goto LAB_0021b65b;
                  if ((code **)local_2a8._0_8_ != &local_298) {
                    operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
                  }
                  if (uVar3 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"():",3);
                    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0xc92)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"visibility",10);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"\n",1);
                    if (local_310 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_340,&local_360,local_318);
                      ::std::__cxx11::string::operator=((string *)local_310,(string *)local_340);
                      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                        operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_360._M_dataplus._M_p != &local_360.field_2) {
                        operator_delete(local_360._M_dataplus._M_p,
                                        local_360.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
                    ::std::ios_base::~ios_base(local_238);
                    AttrMetas::operator=(&local_2e0->_metas,(AttrMetas *)(p_Var10 + 7));
                    pcVar12 = "visibility";
                    pcVar11 = "";
LAB_0021ba28:
                    iVar5 = 3;
                    local_2a8._0_8_ = &local_298;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2a8,pcVar12,pcVar11);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_2d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2a8);
                    if ((code **)local_2a8._0_8_ != &local_298) {
                      operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
                    }
                    goto LAB_0021c018;
                  }
                }
                else {
LAB_0021b65b:
                  if ((code **)local_2a8._0_8_ != &local_298) {
                    operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
                  }
                }
                local_2a8._8_8_ = 0;
                local_2a8._0_8_ = VisibilityEnumHandler;
                pcStack_290 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_298 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_340._0_8_ = local_340 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_340,"visibility","");
                bVar4 = options->strict_allowedToken_check;
                local_48 = (code *)0x0;
                pcStack_40 = (code *)0x0;
                local_58._M_unused._M_object = (void *)0x0;
                local_58._8_8_ = 0;
                if (local_298 != (code *)0x0) {
                  (*local_298)(&local_58,local_2a8,2);
                  local_48 = local_298;
                  pcStack_40 = pcStack_290;
                }
                bVar4 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                  ((string *)local_340,bVar4,
                                   (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,
                                   (Attribute *)prop,local_2e0,local_310,local_318);
                if (local_48 != (code *)0x0) {
                  (*local_48)(&local_58,&local_58,__destroy_functor);
                }
                if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                iVar5 = 1;
                if (bVar4) {
                  AttrMetas::operator=(&local_2e0->_metas,(AttrMetas *)(p_Var10 + 7));
                  pcVar12 = "visibility";
                  pcVar11 = "";
LAB_0021bbd8:
                  local_340._0_8_ = local_340 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_340,pcVar12,pcVar11);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_2d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_340);
                  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  iVar5 = 3;
                }
              }
              else {
                iVar5 = ::std::__cxx11::string::compare((char *)p_Var2);
                if (iVar5 != 0) {
                  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                  local_128 = p_Var2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_f8,*(long *)(p_Var10 + 1),
                             (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
                  local_2a8._0_8_ = &local_298;
                  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"extent","")
                  ;
                  anon_unknown_0::ParseExtentAttribute
                            ((ParseResult *)local_340,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_2d8,&local_f8,prop,(string *)local_2a8,local_120);
                  if ((code **)local_2a8._0_8_ != &local_298) {
                    operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                    operator_delete(local_f8._M_dataplus._M_p,
                                    local_f8.field_2._M_allocated_capacity + 1);
                  }
                  iVar5 = 0;
                  if ((local_340._0_8_ & 0xfffffffd) == 0) {
                    iVar5 = 3;
LAB_0021bcb7:
                    bVar4 = false;
                  }
                  else {
                    bVar4 = true;
                    if (local_340._0_4_ != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,"():",3);
                      poVar6 = (ostream *)
                               ::std::ostream::operator<<((ostringstream *)local_2a8,0xc95);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      local_308[0] = local_2f8;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_308,"Parsing attribute `extent` failed. Error: {}",
                                 "");
                      fmt::format<std::__cxx11::string>
                                ((string *)&local_360,(fmt *)local_308,(string *)(local_340 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)prop);
                      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_2a8,local_360._M_dataplus._M_p,
                                          local_360._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_360._M_dataplus._M_p != &local_360.field_2) {
                        operator_delete(local_360._M_dataplus._M_p,
                                        local_360.field_2._M_allocated_capacity + 1);
                      }
                      psVar13 = local_318;
                      if (local_308[0] != local_2f8) {
                        operator_delete(local_308[0],local_2f8[0] + 1);
                      }
                      if (psVar13 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar7 = (long *)::std::__cxx11::string::_M_append
                                                   ((char *)local_308,
                                                    (ulong)(psVar13->_M_dataplus)._M_p);
                        psVar1 = (size_type *)(plVar7 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar7 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar1) {
                          local_360.field_2._M_allocated_capacity = *psVar1;
                          local_360.field_2._8_8_ = plVar7[3];
                          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
                        }
                        else {
                          local_360.field_2._M_allocated_capacity = *psVar1;
                          local_360._M_dataplus._M_p = (pointer)*plVar7;
                        }
                        local_360._M_string_length = plVar7[1];
                        *plVar7 = (long)psVar1;
                        plVar7[1] = 0;
                        *(undefined1 *)(plVar7 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_360);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_360._M_dataplus._M_p != &local_360.field_2) {
                          operator_delete(local_360._M_dataplus._M_p,
                                          local_360.field_2._M_allocated_capacity + 1);
                        }
                        if (local_308[0] != local_2f8) {
                          operator_delete(local_308[0],local_2f8[0] + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
                      ::std::ios_base::~ios_base(local_238);
                      iVar5 = 1;
                      goto LAB_0021bcb7;
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_340._8_8_ != &aStack_328) {
                    operator_delete((void *)local_340._8_8_,aStack_328._M_allocated_capacity + 1);
                  }
                  p_Var2 = local_128;
                  if (bVar4) {
                    cVar8 = ::std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::find(&local_2d8,(key_type *)local_128);
                    if ((_Rb_tree_header *)cVar8._M_node == &local_2d8._M_impl.super__Rb_tree_header
                       ) {
                      pmVar9 = ::std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                               ::operator[](local_130,(key_type *)p_Var2);
                      ::std::__cxx11::string::_M_assign((string *)pmVar9);
                      (pmVar9->_attrib)._varying_authored = (bool)p_Var10[3].field_0x4;
                      (pmVar9->_attrib)._variability = p_Var10[3]._M_color;
                      ::std::__cxx11::string::_M_assign((string *)&(pmVar9->_attrib)._type_name);
                      linb::any::operator=
                                ((any *)&(pmVar9->_attrib)._var,(any *)&p_Var10[4]._M_parent);
                      (pmVar9->_attrib)._var._blocked = SUB41(p_Var10[5]._M_color,0);
                      ::std::
                      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ::operator=(&(pmVar9->_attrib)._var._ts._samples,
                                  (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                   *)&p_Var10[5]._M_parent);
                      (pmVar9->_attrib)._var._ts._dirty = SUB41(p_Var10[6]._M_color,0);
                      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                (&(pmVar9->_attrib)._paths,
                                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                 &p_Var10[6]._M_parent);
                      AttrMetas::operator=(&(pmVar9->_attrib)._metas,(AttrMetas *)(p_Var10 + 7));
                      *(_Base_ptr *)&pmVar9->_listOpQual = p_Var10[0x17]._M_parent;
                      (pmVar9->_rel).type = *(Type *)&p_Var10[0x17]._M_left;
                      Path::operator=(&(pmVar9->_rel).targetPath,(Path *)&p_Var10[0x17]._M_right);
                      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                                (&(pmVar9->_rel).targetPathVector,
                                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                 &p_Var10[0x1e]._M_parent);
                      (pmVar9->_rel).listOpQual = p_Var10[0x1f]._M_color;
                      AttrMetas::operator=
                                (&(pmVar9->_rel)._metas,(AttrMetas *)&p_Var10[0x1f]._M_parent);
                      (pmVar9->_rel)._varying_authored = *(bool *)&p_Var10[0x2f]._M_left;
                      ::std::__cxx11::string::_M_assign((string *)&pmVar9->_prop_value_type_name);
                      pmVar9->_has_custom = *(bool *)&p_Var10[0x30]._M_right;
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&local_2d8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var2);
                    }
                    cVar8 = ::std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::find(&local_2d8,(key_type *)p_Var2);
                    iVar5 = 0;
                    if ((_Rb_tree_header *)cVar8._M_node == &local_2d8._M_impl.super__Rb_tree_header
                       ) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2a8,"():",3);
                      poVar6 = (ostream *)
                               ::std::ostream::operator<<((ostringstream *)local_2a8,0xc97);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_340,"Unsupported/unimplemented property: ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)p_Var2);
                      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_2a8,(char *)local_340._0_8_,
                                          local_340._8_8_);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                        operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                      }
                      if (local_310 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar7 = (long *)::std::__cxx11::string::_M_append
                                                   ((char *)&local_360,
                                                    (ulong)(local_318->_M_dataplus)._M_p);
                        psVar1 = (size_type *)(plVar7 + 2);
                        if ((size_type *)*plVar7 == psVar1) {
                          local_340._16_8_ = *psVar1;
                          aStack_328._M_allocated_capacity = plVar7[3];
                          local_340._0_8_ = local_340 + 0x10;
                        }
                        else {
                          local_340._16_8_ = *psVar1;
                          local_340._0_8_ = (size_type *)*plVar7;
                        }
                        local_340._8_8_ = plVar7[1];
                        *plVar7 = (long)psVar1;
                        plVar7[1] = 0;
                        *(undefined1 *)(plVar7 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)local_310,(string *)local_340);
                        if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                          operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_360._M_dataplus._M_p != &local_360.field_2) {
                          operator_delete(local_360._M_dataplus._M_p,
                                          local_360.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
                      ::std::ios_base::~ios_base(local_238);
                    }
                  }
                  goto LAB_0021c018;
                }
                local_2a8._0_8_ = &local_298;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"purpose","");
                cVar8 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find(&local_2d8,(key_type *)local_2a8);
                if ((code **)local_2a8._0_8_ != &local_298) {
                  operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
                }
                iVar5 = 3;
                if ((_Rb_tree_header *)cVar8._M_node != &local_2d8._M_impl.super__Rb_tree_header)
                goto LAB_0021c018;
                if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                  local_2a8._0_8_ = &local_298;
                  local_2a8._8_8_ = 0;
                  local_298 = (code *)((ulong)local_298 & 0xffffffffffffff00);
                }
                else {
                  Attribute::type_name_abi_cxx11_((string *)local_2a8,(Attribute *)prop);
                }
                local_340._0_8_ = local_340 + 0x10;
                local_340._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_340._16_6_ = 0x6e656b6f74;
                if (local_2a8._8_8_ == 5) {
                  iVar5 = bcmp((void *)local_2a8._0_8_,local_340 + 0x10,5);
                  if ((iVar5 != 0) ||
                     (uVar3 = *(uint *)((long)&p_Var10[0x17]._M_parent + 4), 1 < uVar3))
                  goto LAB_0021ba63;
                  if ((code **)local_2a8._0_8_ != &local_298) {
                    operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
                  }
                  if (uVar3 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"():",3);
                    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2a8,0xc94)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"purpose",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a8,"\n",1);
                    if (local_310 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_340,&local_360,local_318);
                      ::std::__cxx11::string::operator=((string *)local_310,(string *)local_340);
                      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                        operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_360._M_dataplus._M_p != &local_360.field_2) {
                        operator_delete(local_360._M_dataplus._M_p,
                                        local_360.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
                    ::std::ios_base::~ios_base(local_238);
                    AttrMetas::operator=(&local_2e8->_metas,(AttrMetas *)(p_Var10 + 7));
                    pcVar12 = "purpose";
                    pcVar11 = "";
                    goto LAB_0021ba28;
                  }
                }
                else {
LAB_0021ba63:
                  if ((code **)local_2a8._0_8_ != &local_298) {
                    operator_delete((void *)local_2a8._0_8_,(ulong)((long)local_298 + 1));
                  }
                }
                local_2a8._8_8_ = 0;
                local_2a8._0_8_ = PurposeEnumHandler;
                pcStack_290 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_298 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_340._0_8_ = local_340 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"purpose","");
                bVar4 = options->strict_allowedToken_check;
                local_68 = (code *)0x0;
                pcStack_60 = (code *)0x0;
                local_78._M_unused._M_object = (void *)0x0;
                local_78._8_8_ = 0;
                if (local_298 != (code *)0x0) {
                  (*local_298)(&local_78,local_2a8,2);
                  local_68 = local_298;
                  pcStack_60 = pcStack_290;
                }
                bVar4 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  ((string *)local_340,bVar4,
                                   (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,(Attribute *)prop,
                                   local_2e8,local_310,local_318);
                if (local_68 != (code *)0x0) {
                  (*local_68)(&local_78,&local_78,__destroy_functor);
                }
                if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                iVar5 = 1;
                if (bVar4) {
                  AttrMetas::operator=(&local_2e8->_metas,(AttrMetas *)(p_Var10 + 7));
                  pcVar12 = "purpose";
                  pcVar11 = "";
                  goto LAB_0021bbd8;
                }
              }
              if (local_298 != (code *)0x0) {
                (*local_298)(local_2a8,local_2a8,3);
              }
            }
          }
        }
LAB_0021c018:
        if ((iVar5 != 3) && (iVar5 != 0)) break;
        p_Var10 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
        bVar14 = p_Var10 == local_100;
      } while (!bVar14);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_2d8,(_Link_type)local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar14;
}

Assistant:

bool ReconstructPrim<SphereLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SphereLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;

  (void)options;
  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:color", SphereLight, light->color)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", SphereLight, light->radius)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:intensity", SphereLight,
                   light->intensity)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, SphereLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, SphereLight,
                       light->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, SphereLight, light->extent)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}